

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SourceRange sourceRange;
  SourceRange range;
  sockaddr *__addr;
  bool bVar1;
  int iVar2;
  NameSyntax *pNVar3;
  undefined4 extraout_var;
  ActionBlockSyntax *pAVar4;
  undefined4 extraout_var_00;
  SourceLocation args_2;
  WaitOrderStatement *pWVar5;
  undefined8 in_RCX;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX_01;
  long in_RSI;
  ASTContext *in_RDI;
  WaitOrderStatement *result;
  Statement *ifFalse;
  Statement *ifTrue;
  Expression *ev;
  NameSyntax *name;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  Statement *in_stack_fffffffffffffdc8;
  Compilation *in_stack_fffffffffffffdd0;
  ASTContext *in_stack_fffffffffffffde8;
  SourceLocation in_stack_fffffffffffffdf0;
  SourceLocation in_stack_fffffffffffffdf8;
  undefined4 uVar6;
  DiagCode in_stack_fffffffffffffe04;
  undefined4 uVar7;
  Statement **in_stack_fffffffffffffe10;
  StatementSyntax *in_stack_fffffffffffffe18;
  SyntaxNode *in_stack_fffffffffffffe20;
  bitmask<slang::ast::ASTFlags> local_b8;
  undefined8 local_b0;
  NameSyntax *local_a8;
  const_iterator local_a0;
  const_iterator local_80;
  long local_70;
  SmallVectorBase<const_slang::ast::Expression_*> local_68 [2];
  undefined8 local_28;
  sockaddr *local_20;
  long local_18;
  ASTContext *local_10;
  WaitOrderStatement *local_8;
  undefined4 extraout_var_01;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbe9844);
  local_70 = local_18 + 0x78;
  local_80 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0xbe9865);
  local_a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0xbe98a4);
  do {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffdd0,
                       (iterator_base<const_slang::syntax::NameSyntax_*> *)in_stack_fffffffffffffdc8
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                         ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xbe9b7f);
      if (pAVar4->statement != (StatementSyntax *)0x0) {
        pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                           ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xbe9bac);
        Statement::bind((int)pAVar4->statement,local_20,(socklen_t)local_28);
      }
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                         ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xbe9bff);
      src = extraout_RDX;
      if (pAVar4->elseClause != (ElseClauseSyntax *)0x0) {
        not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                  ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xbe9c26);
        in_stack_fffffffffffffe20 =
             not_null<slang::syntax::SyntaxNode_*>::operator->
                       ((not_null<slang::syntax::SyntaxNode_*> *)0xbe9c3f);
        in_stack_fffffffffffffe18 =
             slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>
                       (in_stack_fffffffffffffe20);
        iVar2 = Statement::bind((int)in_stack_fffffffffffffe18,local_20,(socklen_t)local_28);
        in_stack_fffffffffffffe10 = (Statement **)CONCAT44(extraout_var_00,iVar2);
        src = extraout_RDX_00;
      }
      args_2._0_4_ = SmallVectorBase<const_slang::ast::Expression_*>::copy
                               (local_68,(EVP_PKEY_CTX *)local_10,src);
      args_2._4_4_ = extraout_var_01;
      uVar6 = (undefined4)extraout_RDX_01;
      uVar7 = (undefined4)((ulong)extraout_RDX_01 >> 0x20);
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe20);
      pWVar5 = BumpAllocator::
               emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                         ((BumpAllocator *)in_stack_fffffffffffffe20,
                          (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                          in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(Statement **)args_2,
                          (SourceRange *)CONCAT44(uVar7,uVar6));
      range.startLoc._4_4_ = uVar7;
      range.startLoc._0_4_ = uVar6;
      range.endLoc = args_2;
      bVar1 = ASTContext::requireTimingAllowed(local_10,range);
      local_8 = pWVar5;
      if (!bVar1) {
        local_8 = (WaitOrderStatement *)
                  Statement::badStmt(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      }
LAB_00be9dce:
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbe9ddb);
      return &local_8->super_Statement;
    }
    pNVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                          *)0xbe9913);
    __addr = local_20;
    local_a8 = pNVar3;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b8,None);
    iVar2 = Expression::bind((int)pNVar3,__addr,(socklen_t)local_b8.m_bits);
    local_b0 = CONCAT44(extraout_var,iVar2);
    bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffdd0);
    if (bVar1) {
      local_8 = (WaitOrderStatement *)
                Statement::badStmt(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      goto LAB_00be9dce;
    }
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbe9a2a);
    bVar1 = Type::isEvent((Type *)0xbe9a41);
    if (!bVar1) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe20);
      sourceRange.endLoc = in_stack_fffffffffffffdf8;
      sourceRange.startLoc = in_stack_fffffffffffffdf0;
      ASTContext::addDiag(in_stack_fffffffffffffde8,in_stack_fffffffffffffe04,sourceRange);
      local_8 = (WaitOrderStatement *)
                Statement::badStmt(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      goto LAB_00be9dce;
    }
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffdd0,
               (Expression **)in_stack_fffffffffffffdc8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<const_slang::syntax::NameSyntax_*>,_false>
                *)in_stack_fffffffffffffdd0);
  } while( true );
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());

    if (!context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}